

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::GetLocationPath
          (MethodDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *this_00;
  ServiceDescriptor *this_01;
  char *pcVar1;
  int __c;
  value_type_conflict3 *__x;
  value_type_conflict3 local_20 [2];
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  MethodDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  this_01 = service(this);
  ServiceDescriptor::GetLocationPath(this_01,local_18);
  local_20[1] = 2;
  __x = local_20 + 1;
  std::vector<int,_std::allocator<int>_>::push_back(local_18,__x);
  this_00 = local_18;
  pcVar1 = index(this,(char *)__x,__c);
  local_20[0] = (value_type_conflict3)pcVar1;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,local_20);
  return;
}

Assistant:

void MethodDescriptor::GetLocationPath(std::vector<int>* output) const {
  service()->GetLocationPath(output);
  output->push_back(ServiceDescriptorProto::kMethodFieldNumber);
  output->push_back(index());
}